

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildNode.cpp
# Opt level: O3

bool __thiscall
llbuild::buildsystem::BuildNode::configureAttribute
          (BuildNode *this,ConfigureContext *ctx,StringRef name,ArrayRef<llvm::StringRef> values)

{
  char *pcVar1;
  pointer pSVar2;
  pointer pSVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Child local_78;
  Child CStack_70;
  pointer local_68;
  Child local_58 [2];
  NodeKind local_48;
  char cStack_47;
  undefined6 uStack_46;
  Child local_40;
  NodeKind local_30;
  char cStack_2f;
  undefined6 uStack_2e;
  StringRef local_28;
  
  local_28.Length = name.Length;
  local_28.Data = name.Data;
  if (local_28.Length == 0x15) {
    auVar7[0] = -(local_28.Data[5] == 's');
    auVar7[1] = -(local_28.Data[6] == 'c');
    auVar7[2] = -(local_28.Data[7] == 'a');
    auVar7[3] = -(local_28.Data[8] == 'n');
    auVar7[4] = -(local_28.Data[9] == '-');
    auVar7[5] = -(local_28.Data[10] == 'a');
    auVar7[6] = -(local_28.Data[0xb] == 'f');
    auVar7[7] = -(local_28.Data[0xc] == 't');
    auVar7[8] = -(local_28.Data[0xd] == 'e');
    auVar7[9] = -(local_28.Data[0xe] == 'r');
    auVar7[10] = -(local_28.Data[0xf] == '-');
    auVar7[0xb] = -(local_28.Data[0x10] == 'p');
    auVar7[0xc] = -(local_28.Data[0x11] == 'a');
    auVar7[0xd] = -(local_28.Data[0x12] == 't');
    auVar7[0xe] = -(local_28.Data[0x13] == 'h');
    auVar7[0xf] = -(local_28.Data[0x14] == 's');
    auVar5[0] = -(*local_28.Data == 'm');
    auVar5[1] = -(local_28.Data[1] == 'u');
    auVar5[2] = -(local_28.Data[2] == 's');
    auVar5[3] = -(local_28.Data[3] == 't');
    auVar5[4] = -(local_28.Data[4] == '-');
    auVar5[5] = -(local_28.Data[5] == 's');
    auVar5[6] = -(local_28.Data[6] == 'c');
    auVar5[7] = -(local_28.Data[7] == 'a');
    auVar5[8] = -(local_28.Data[8] == 'n');
    auVar5[9] = -(local_28.Data[9] == '-');
    auVar5[10] = -(local_28.Data[10] == 'a');
    auVar5[0xb] = -(local_28.Data[0xb] == 'f');
    auVar5[0xc] = -(local_28.Data[0xc] == 't');
    auVar5[0xd] = -(local_28.Data[0xd] == 'e');
    auVar5[0xe] = -(local_28.Data[0xe] == 'r');
    auVar5[0xf] = -(local_28.Data[0xf] == '-');
    auVar5 = auVar5 & auVar7;
    if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015ce28;
    llbuild::basic::StringList::StringList<llvm::StringRef>((StringList *)local_58,values);
    llbuild::basic::StringList::getValues
              ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&local_78,
               (StringList *)local_58);
    pSVar2 = (this->mustScanAfterPaths).
             super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar3 = (this->mustScanAfterPaths).
             super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->mustScanAfterPaths).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_78;
    (this->mustScanAfterPaths).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)CStack_70;
    (this->mustScanAfterPaths).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_68;
    local_78 = (Child)0x0;
    CStack_70 = (Child)0x0;
    local_68 = (pointer)0x0;
    if (pSVar2 != (pointer)0x0) {
      operator_delete(pSVar2,(long)pSVar3 - (long)pSVar2);
      if (local_78.twine != (Twine *)0x0) {
        operator_delete(local_78.twine,(long)local_68 - (long)local_78);
      }
    }
  }
  else {
    if ((local_28.Length != 0x1a) ||
       (auVar6[0] = -(local_28.Data[10] == 'c'), auVar6[1] = -(local_28.Data[0xb] == 'l'),
       auVar6[2] = -(local_28.Data[0xc] == 'u'), auVar6[3] = -(local_28.Data[0xd] == 's'),
       auVar6[4] = -(local_28.Data[0xe] == 'i'), auVar6[5] = -(local_28.Data[0xf] == 'o'),
       auVar6[6] = -(local_28.Data[0x10] == 'n'), auVar6[7] = -(local_28.Data[0x11] == '-'),
       auVar6[8] = -(local_28.Data[0x12] == 'p'), auVar6[9] = -(local_28.Data[0x13] == 'a'),
       auVar6[10] = -(local_28.Data[0x14] == 't'), auVar6[0xb] = -(local_28.Data[0x15] == 't'),
       auVar6[0xc] = -(local_28.Data[0x16] == 'e'), auVar6[0xd] = -(local_28.Data[0x17] == 'r'),
       auVar6[0xe] = -(local_28.Data[0x18] == 'n'), auVar6[0xf] = -(local_28.Data[0x19] == 's'),
       auVar4[0] = -(*local_28.Data == 'c'), auVar4[1] = -(local_28.Data[1] == 'o'),
       auVar4[2] = -(local_28.Data[2] == 'n'), auVar4[3] = -(local_28.Data[3] == 't'),
       auVar4[4] = -(local_28.Data[4] == 'e'), auVar4[5] = -(local_28.Data[5] == 'n'),
       auVar4[6] = -(local_28.Data[6] == 't'), auVar4[7] = -(local_28.Data[7] == '-'),
       auVar4[8] = -(local_28.Data[8] == 'e'), auVar4[9] = -(local_28.Data[9] == 'x'),
       auVar4[10] = -(local_28.Data[10] == 'c'), auVar4[0xb] = -(local_28.Data[0xb] == 'l'),
       auVar4[0xc] = -(local_28.Data[0xc] == 'u'), auVar4[0xd] = -(local_28.Data[0xd] == 's'),
       auVar4[0xe] = -(local_28.Data[0xe] == 'i'), auVar4[0xf] = -(local_28.Data[0xf] == 'o'),
       auVar4 = auVar4 & auVar6,
       (ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) != 0xffff)) {
LAB_0015ce28:
      llvm::Twine::Twine((Twine *)local_58,"unexpected attribute: \'",&local_28);
      llvm::Twine::Twine((Twine *)&local_40,"\'");
      if ((local_48 == NullKind) || (local_30 == NullKind)) {
        local_68 = (pointer)CONCAT62(local_68._2_6_,0x100);
      }
      else if (local_48 == EmptyKind) {
        local_68 = (pointer)CONCAT62(uStack_2e,CONCAT11(cStack_2f,local_30));
      }
      else if (local_30 == EmptyKind) {
        local_68 = (pointer)CONCAT62(uStack_46,CONCAT11(cStack_47,local_48));
      }
      else {
        if (cStack_47 != '\x01') {
          local_48 = TwineKind;
          local_58[0].twine = (Twine *)local_58;
        }
        if (cStack_2f != '\x01') {
          local_30 = TwineKind;
          local_40.twine = (Twine *)&local_40;
        }
        llvm::Twine::Twine((Twine *)&local_78,local_58[0],local_48,local_40,local_30);
      }
      ConfigureContext::error(ctx,(Twine *)&local_78);
      return false;
    }
    llbuild::basic::StringList::StringList<llvm::StringRef>((StringList *)&local_78,values);
    local_58[0] = local_78;
    if ((Child *)&this->exclusionPatterns != &local_78) {
      (this->exclusionPatterns).size = (uint64_t)CStack_70;
      pcVar1 = (this->exclusionPatterns).contents;
      if (pcVar1 != (char *)0x0) {
        operator_delete__(pcVar1);
      }
      (this->exclusionPatterns).contents = (char *)local_78;
      return true;
    }
  }
  if (local_58[0].twine != (Twine *)0x0) {
    operator_delete__(local_58[0].twine);
  }
  return true;
}

Assistant:

bool BuildNode::configureAttribute(const ConfigureContext& ctx, StringRef name,
                                   ArrayRef<StringRef> values) {
  if (name == "content-exclusion-patterns") {
    exclusionPatterns = basic::StringList(values);
    return true;
  } else if (name == "must-scan-after-paths") {
    mustScanAfterPaths = basic::StringList(values).getValues();
    return true;
  }

  // We don't support any other custom attributes.
  ctx.error("unexpected attribute: '" + name + "'");
  return false;
}